

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void server::checkteamkills(void)

{
  uint uVar1;
  bool bVar2;
  long lVar3;
  uint uVar4;
  uint *puVar5;
  uint *puVar6;
  ulong uVar7;
  
  uVar4 = gamemode + 3;
  if (((uVar4 < 0x1a) && ((0x3ffffe8UL >> ((ulong)uVar4 & 0x3f) & 1) != 0)) &&
     (lVar3 = (long)_DAT_00193e34, 0 < lVar3)) {
    puVar6 = (uint *)0x0;
    puVar5 = teamkillkicks;
    do {
      uVar1 = *puVar5;
      if (((uVar1 & 1 << ((byte)uVar4 & 0x1f)) != 0) &&
         ((puVar6 == (uint *)0x0 || ((uVar1 & ~*puVar6) == 0 && uVar1 != *puVar6)))) {
        puVar6 = puVar5;
      }
      puVar5 = puVar5 + 3;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
    if ((puVar6 != (uint *)0x0) && (0 < (long)(int)DAT_00193e44)) {
      uVar7 = (long)(int)DAT_00193e44 + 1;
      lVar3 = teamkills;
      do {
        if ((int)puVar6[1] <= *(int *)(lVar3 + -0xc + uVar7 * 8)) {
          if (0 < (int)puVar6[2]) {
            addban(*(uint *)(lVar3 + -0x10 + uVar7 * 8),puVar6[2]);
          }
          kickclients(*(uint *)(lVar3 + -0x10 + uVar7 * 8),(clientinfo *)0x0);
          uVar4 = DAT_00193e44 - 1;
          bVar2 = 1 < (int)DAT_00193e44;
          lVar3 = teamkills;
          DAT_00193e44 = uVar4;
          if (bVar2) {
            *(undefined8 *)(teamkills + -0x10 + uVar7 * 8) =
                 *(undefined8 *)(teamkills + (ulong)uVar4 * 8);
            lVar3 = teamkills;
          }
        }
        uVar7 = uVar7 - 1;
      } while (1 < uVar7);
    }
  }
  shouldcheckteamkills = 0;
  return;
}

Assistant:

void checkteamkills()
    {
        teamkillkick *kick = NULL;
        if(m_timed) loopv(teamkillkicks) if(teamkillkicks[i].match(gamemode) && (!kick || kick->includes(teamkillkicks[i])))
            kick = &teamkillkicks[i];
        if(kick) loopvrev(teamkills)
        {
            teamkillinfo &tk = teamkills[i];
            if(tk.teamkills >= kick->limit)
            {
                if(kick->ban > 0) addban(tk.ip, kick->ban);
                kickclients(tk.ip);
                teamkills.removeunordered(i);
            }
        }
        shouldcheckteamkills = false;
    }